

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProducerConsumerQueue.h
# Opt level: O3

void __thiscall
folly::ProducerConsumerQueue<int>::~ProducerConsumerQueue(ProducerConsumerQueue<int> *this)

{
  free(this->records_);
  return;
}

Assistant:

~ProducerConsumerQueue() {
    // We need to destruct anything that may still exist in our queue.
    // (No real synchronization needed at destructor time: only one
    // thread can be doing this.)
    if (!std::is_trivially_destructible<T>::value) {
      int read = readIndex_;
      int end = writeIndex_;
      while (read != end) {
        records_[read].~T();
        if (++read == size_) {
          read = 0;
        }
      }
    }

    std::free(records_);
  }